

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

void destroy_parameters(opj_decompress_parameters *parameters)

{
  if (parameters != (opj_decompress_parameters *)0x0) {
    if (parameters->precision != (opj_precision *)0x0) {
      free(parameters->precision);
      parameters->precision = (opj_precision *)0x0;
    }
    free(parameters->comps_indices);
    parameters->comps_indices = (OPJ_UINT32 *)0x0;
  }
  return;
}

Assistant:

static void destroy_parameters(opj_decompress_parameters* parameters)
{
    if (parameters) {
        if (parameters->precision) {
            free(parameters->precision);
            parameters->precision = NULL;
        }

        free(parameters->comps_indices);
        parameters->comps_indices = NULL;
    }
}